

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O2

Module * mocker::allocateRegistersNaively(Module *__return_storage_ptr__,Module *module)

{
  long lVar1;
  _List_node_base *p_Var2;
  uint __line;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  char *pcVar8;
  pointer p_Var9;
  iterator iVar10;
  mapped_type *pmVar11;
  shared_ptr<mocker::nasm::Register> *psVar12;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  pointer p_Var14;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *plVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  long lVar17;
  _List_node_base *p_Var18;
  _List_node_base *p_Var19;
  shared_ptr<mocker::nasm::Register> *reg;
  _Alloc_hider __k;
  shared_ptr<mocker::nasm::Register> pReg;
  shared_ptr<mocker::nasm::Addr> dest;
  shared_ptr<mocker::nasm::Addr> operand;
  shared_ptr<mocker::nasm::Register> vReg;
  allocator<char> local_2a9;
  shared_ptr<mocker::nasm::LabelAddr> labelAddr;
  Section local_298;
  shared_ptr<mocker::nasm::MemoryAddr> memAddr;
  anon_class_16_2_521579e4 load;
  shared_ptr<mocker::nasm::Mov> p;
  anon_class_16_2_521579e4 store;
  shared_ptr<mocker::nasm::Addr> local_210;
  shared_ptr<mocker::nasm::Register> reg1;
  undefined4 local_1f0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  RegMap<std::size_t> offsets;
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  funcBegs;
  size_t alignSz;
  __shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2> local_170 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2> local_160 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2> local_150 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2> local_140;
  Line local_130;
  Line local_100;
  key_type local_d0;
  Line local_b0;
  Line local_80;
  string local_50;
  
  nasm::Module::Module(__return_storage_ptr__,module);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,".text",&local_2a9);
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&__return_storage_ptr__->sections,&local_d0);
  std::__cxx11::string::string((string *)&local_50,(string *)pmVar7);
  nasm::Section::Section(&local_298,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  funcBegs.
  super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  funcBegs.
  super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  funcBegs.
  super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar15 = &pmVar7->lines;
  offsets._M_h._M_buckets = (__buckets_ptr)plVar15;
  while (offsets._M_h._M_buckets =
              (__buckets_ptr)
              (((_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
               &((_List_node_base *)offsets._M_h._M_buckets)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next,
        (list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)offsets._M_h._M_buckets !=
        plVar15) {
    if ((((_List_node_base *)((long)offsets._M_h._M_buckets + 0x30))->_M_next ==
         (_List_node_base *)0x0) &&
       (pcVar8 = (char *)std::__cxx11::string::at((ulong)((long)offsets._M_h._M_buckets + 0x10)),
       *pcVar8 != '.')) {
      std::
      vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
      ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>&>
                ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                  *)&funcBegs,(_List_const_iterator<mocker::nasm::Line> *)&offsets);
    }
  }
  offsets._M_h._M_buckets = (__buckets_ptr)plVar15;
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
  ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>>
            ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
              *)&funcBegs,(_List_const_iterator<mocker::nasm::Line> *)&offsets._M_h);
  p_Var14 = funcBegs.
            super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  p_Var9 = funcBegs.
           super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (p_Var9 == p_Var14) {
      std::
      _Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
      ::~_Vector_base(&funcBegs.
                       super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                     );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&offsets,".text",(allocator<char> *)&local_100);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&__return_storage_ptr__->sections,(key_type *)&offsets);
      nasm::Section::operator=(pmVar7,&local_298);
      std::__cxx11::string::~string((string *)&offsets);
      nasm::Section::~Section(&local_298);
      std::__cxx11::string::~string((string *)&local_d0);
      return __return_storage_ptr__;
    }
    p_Var19 = p_Var9->_M_node;
    p_Var2 = p_Var9[1]._M_node;
    p_Var9 = p_Var9 + 1;
    offsets._M_h._M_buckets = &offsets._M_h._M_single_bucket;
    offsets._M_h._M_bucket_count = 1;
    offsets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    offsets._M_h._M_element_count = 0;
    offsets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    offsets._M_h._M_rehash_policy._M_next_resize = 0;
    offsets._M_h._M_single_bucket = (__node_base_ptr)0x0;
    lVar17 = 0;
    for (p_Var18 = p_Var19; sVar5 = offsets._M_h._M_element_count, p_Var18 != p_Var2;
        p_Var18 = p_Var18->_M_next) {
      if (p_Var18[3]._M_next != (_List_node_base *)0x0) {
        nasm::getInvolvedRegs
                  ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&local_100,(shared_ptr<mocker::nasm::Inst> *)(p_Var18 + 3));
        sVar6 = local_100.label._M_string_length;
        for (__k._M_p = local_100.label._M_dataplus._M_p; __k._M_p != (pointer)sVar6;
            __k._M_p = __k._M_p + 0x10) {
          pcVar8 = (char *)std::__cxx11::string::at
                                     ((ulong)&((((key_type *)__k._M_p)->
                                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr)->identifier);
          if ((*pcVar8 == 'v') &&
             (iVar10 = std::
                       _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&offsets._M_h,(key_type *)__k._M_p),
             iVar10.
             super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
             ._M_cur == (__node_type *)0x0)) {
            pmVar11 = std::__detail::
                      _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&offsets._M_h,(key_type *)__k._M_p);
            lVar1 = lVar17 * 8;
            lVar17 = lVar17 + 1;
            *pmVar11 = lVar1 + 8;
          }
        }
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)&local_100);
      }
    }
    nasm::Line::Line(&local_100,(Line *)(p_Var19 + 1));
    std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
    emplace_back<mocker::nasm::Line>(&local_298.lines,&local_100);
    nasm::Line::~Line(&local_100);
    p_Var19 = p_Var19->_M_next;
    std::dynamic_pointer_cast<mocker::nasm::Push,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&local_80);
    if (local_80.label._M_dataplus._M_p == (pointer)0x0) {
      __assert_fail("nasm::dyc<nasm::Push>(lineIter->inst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                    ,0xf8,
                    "void mocker::(anonymous namespace)::allocate(LineIter, LineIter, nasm::Section &)"
                   );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80.label._M_string_length);
    nasm::Line::Line(&local_80,(Line *)(p_Var19 + 1));
    std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
    emplace_back<mocker::nasm::Line>(&local_298.lines,&local_80);
    nasm::Line::~Line(&local_80);
    p_Var19 = p_Var19->_M_next;
    std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&local_b0);
    if (local_b0.label._M_dataplus._M_p == (pointer)0x0) {
      __assert_fail("nasm::dyc<nasm::Mov>(lineIter->inst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                    ,0xfb,
                    "void mocker::(anonymous namespace)::allocate(LineIter, LineIter, nasm::Section &)"
                   );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0.label._M_string_length);
    nasm::Line::Line(&local_b0,(Line *)(p_Var19 + 1));
    std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
    emplace_back<mocker::nasm::Line>(&local_298.lines,&local_b0);
    nasm::Line::~Line(&local_b0);
    p_Var19 = p_Var19->_M_next;
    if ((sVar5 & 0x1ffffffffffffffe) != 0x1ffffffffffffffe) {
      operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 4;
      psVar12 = nasm::rsp();
      std::make_shared<mocker::nasm::NumericConstant,unsigned_long&>((unsigned_long *)&local_130);
      nasm::Section::
      emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                (&local_298,(OpType *)&operand,psVar12,
                 (shared_ptr<mocker::nasm::NumericConstant> *)&local_130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130.label._M_string_length);
    }
    for (; p_Var19 != p_Var2; p_Var19 = p_Var19->_M_next) {
      if (p_Var19[3]._M_next == (_List_node_base *)0x0) {
        nasm::Line::Line(&local_130,(Line *)(p_Var19 + 1));
        std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
        emplace_back<mocker::nasm::Line>(&local_298.lines,&local_130);
        nasm::Line::~Line(&local_130);
      }
      else {
        nasm::getInvolvedRegs
                  ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&operand,(shared_ptr<mocker::nasm::Inst> *)(p_Var19 + 3));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr._4_4_,
                     operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr._0_4_) ==
            operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi) {
LAB_00125e81:
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&operand);
LAB_00125e8b:
          std::__shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_140,
                     (__shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2> *)(p_Var19 + 3));
          nasm::Section::appendInst(&local_298,(shared_ptr<mocker::nasm::Inst> *)&local_140);
          p_Var16 = &local_140._M_refcount;
        }
        else {
          std::dynamic_pointer_cast<mocker::nasm::Call,mocker::nasm::Inst>
                    ((shared_ptr<mocker::nasm::Inst> *)&dest);
          if (dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
LAB_00125e77:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            goto LAB_00125e81;
          }
          std::dynamic_pointer_cast<mocker::nasm::Leave,mocker::nasm::Inst>
                    ((shared_ptr<mocker::nasm::Inst> *)&pReg);
          if (CONCAT44(pReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._4_4_,
                       pReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._0_4_) != 0) {
LAB_00125e6d:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&pReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            goto LAB_00125e77;
          }
          std::dynamic_pointer_cast<mocker::nasm::Ret,mocker::nasm::Inst>
                    ((shared_ptr<mocker::nasm::Inst> *)&vReg);
          if (CONCAT44(vReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._4_4_,
                       vReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._0_4_) != 0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&vReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            goto LAB_00125e6d;
          }
          std::dynamic_pointer_cast<mocker::nasm::Cqo,mocker::nasm::Inst>
                    ((shared_ptr<mocker::nasm::Inst> *)&labelAddr);
          peVar3 = labelAddr.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&labelAddr.
                      super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&vReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&pReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&operand);
          if (peVar3 != (element_type *)0x0) goto LAB_00125e8b;
          load.text = &local_298;
          load.offsets = (RegMap<std::size_t> *)&offsets._M_h;
          store.offsets = (RegMap<std::size_t> *)&offsets._M_h;
          store.text = load.text;
          std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>
                    ((shared_ptr<mocker::nasm::Inst> *)&p);
          if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::dynamic_pointer_cast<mocker::nasm::BinaryInst,mocker::nasm::Inst>
                      ((shared_ptr<mocker::nasm::Inst> *)&operand);
            if (CONCAT44(operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_,
                         operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_) != 0) {
              std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>,
                         (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                         (CONCAT44(operand.
                                   super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr._4_4_,
                                   operand.
                                   super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr._0_4_) + 0x20));
              anon_unknown_1::dycVReg((shared_ptr<mocker::nasm::Addr> *)&pReg);
              if (CONCAT44(pReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._4_4_,
                           pReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._0_4_) != 0) {
                psVar12 = nasm::r10();
                anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()(&load,psVar12,&pReg);
                p_Var13 = &nasm::r10()->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&dest,
                           p_Var13);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&pReg.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)&pReg,
                         (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                         (CONCAT44(operand.
                                   super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr._4_4_,
                                   operand.
                                   super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr._0_4_) + 0x10));
              anon_unknown_1::dycVReg((shared_ptr<mocker::nasm::Addr> *)&vReg);
              if (CONCAT44(vReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._4_4_,
                           vReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._0_4_) != 0) {
                psVar12 = nasm::r11();
                anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()(&load,psVar12,&vReg);
                p_Var13 = &nasm::r11()->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                           p_Var13);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&vReg.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              vReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
              _0_4_ = *(undefined4 *)
                       (CONCAT44(operand.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._4_4_,
                                 operand.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._0_4_) + 8);
              nasm::Section::
              emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                        (&local_298,(OpType *)&vReg,(shared_ptr<mocker::nasm::Addr> *)&pReg,&dest);
              anon_unknown_1::dycVReg((shared_ptr<mocker::nasm::Addr> *)&vReg);
              if (CONCAT44(vReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._4_4_,
                           vReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._0_4_) != 0) {
                anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()
                          (&store,&vReg,(shared_ptr<mocker::nasm::Addr> *)&pReg);
              }
LAB_001260fa:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&vReg.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              goto LAB_00126104;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::dynamic_pointer_cast<mocker::nasm::Push,mocker::nasm::Inst>
                      ((shared_ptr<mocker::nasm::Inst> *)&operand);
            if (CONCAT44(operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_,
                         operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_) == 0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              std::dynamic_pointer_cast<mocker::nasm::Pop,mocker::nasm::Inst>
                        ((shared_ptr<mocker::nasm::Inst> *)&operand);
              if (CONCAT44(operand.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ._4_4_,operand.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._0_4_) == 0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&operand.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::Lea,mocker::nasm::Inst>
                          ((shared_ptr<mocker::nasm::Inst> *)&operand);
                if (CONCAT44(operand.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._4_4_,
                             operand.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._0_4_) != 0) {
                  std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<mocker::nasm::Register,void>
                            ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                             (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                             (CONCAT44(operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._4_4_,
                                       operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_4_) + 8));
                  anon_unknown_1::dycVReg(&dest);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&pReg.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  if (dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) goto LAB_001261c4;
                  psVar12 = nasm::r10();
                  nasm::Section::
                  emplaceInst<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>const&>
                            (&local_298,psVar12,
                             (shared_ptr<mocker::nasm::Addr> *)
                             (CONCAT44(operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._4_4_,
                                       operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_4_) + 0x18));
                  p_Var13 = &nasm::r10()->
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<mocker::nasm::Register,void>
                            ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                             p_Var13);
                  anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()
                            (&store,(shared_ptr<mocker::nasm::Register> *)&dest,
                             (shared_ptr<mocker::nasm::Addr> *)&pReg);
                  goto LAB_00126104;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&operand.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::Cmp,mocker::nasm::Inst>
                          ((shared_ptr<mocker::nasm::Inst> *)&operand);
                if (CONCAT44(operand.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._4_4_,
                             operand.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._0_4_) != 0) {
                  std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&dest.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>,
                             (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                             (CONCAT44(operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._4_4_,
                                       operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_4_) + 8));
                  anon_unknown_1::dycVReg((shared_ptr<mocker::nasm::Addr> *)&pReg);
                  if (CONCAT44(pReg.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._4_4_,
                               pReg.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._0_4_) != 0) {
                    psVar12 = nasm::r10();
                    anon_unknown_1::loadVReg
                              (psVar12,&pReg,(RegMap<std::size_t> *)&offsets._M_h,&local_298);
                    p_Var13 = &nasm::r10()->
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::operator=
                              ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&dest,
                               p_Var13);
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&pReg.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)&pReg,
                             (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                             (CONCAT44(operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._4_4_,
                                       operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_4_) + 0x18));
                  anon_unknown_1::dycVReg((shared_ptr<mocker::nasm::Addr> *)&vReg);
                  if (CONCAT44(vReg.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._4_4_,
                               vReg.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._0_4_) != 0) {
                    psVar12 = nasm::r11();
                    anon_unknown_1::loadVReg
                              (psVar12,&vReg,(RegMap<std::size_t> *)&offsets._M_h,&local_298);
                    p_Var13 = &nasm::r11()->
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::operator=
                              ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                               p_Var13);
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&vReg.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  nasm::Section::
                  emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                            (&local_298,&dest,(shared_ptr<mocker::nasm::Addr> *)&pReg);
                  goto LAB_00126104;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&operand.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::Set,mocker::nasm::Inst>
                          ((shared_ptr<mocker::nasm::Inst> *)&operand);
                if (CONCAT44(operand.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._4_4_,
                             operand.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._0_4_) == 0) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&operand.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::dynamic_pointer_cast<mocker::nasm::UnaryInst,mocker::nasm::Inst>
                            ((shared_ptr<mocker::nasm::Inst> *)&operand);
                  if (CONCAT44(operand.
                               super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._4_4_,
                               operand.
                               super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._0_4_) == 0) {
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&operand.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::dynamic_pointer_cast<mocker::nasm::IDiv,mocker::nasm::Inst>
                              ((shared_ptr<mocker::nasm::Inst> *)&operand);
                    if (CONCAT44(operand.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._4_4_,
                                 operand.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._0_4_) == 0) {
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&operand.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                    ,0xee,
                                    "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                                   );
                    }
                    anon_unknown_1::dycVReg(&dest);
                    if (dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr != (element_type *)0x0) {
                      psVar12 = nasm::r10();
                      anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()
                                (&load,psVar12,(shared_ptr<mocker::nasm::Register> *)&dest);
                      psVar12 = nasm::r10();
                      nasm::Section::
                      emplaceInst<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Register>const&>
                                (&local_298,psVar12);
                      goto LAB_001261c4;
                    }
                    std::__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<mocker::nasm::IDiv,void>
                              (local_170,
                               (__shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2> *)
                               &operand);
                    nasm::Section::appendInst
                              (&local_298,(shared_ptr<mocker::nasm::Inst> *)local_170);
                    p_Var16 = &local_168;
                  }
                  else {
                    std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<mocker::nasm::Register,void>
                              ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                               (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                               (CONCAT44(operand.
                                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._4_4_,
                                         operand.
                                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._0_4_) + 0x10));
                    anon_unknown_1::dycVReg(&dest);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&pReg.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    if (dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr != (element_type *)0x0) {
                      psVar12 = nasm::r10();
                      anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()
                                (&load,psVar12,(shared_ptr<mocker::nasm::Register> *)&dest);
                      pReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._0_4_ = *(undefined4 *)
                                      (CONCAT44(operand.
                                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._4_4_,
                                                operand.
                                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._0_4_) + 8);
                      psVar12 = nasm::r10();
                      nasm::Section::
                      emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&>
                                (&local_298,(OpType *)&pReg,psVar12);
                      p_Var13 = &nasm::r10()->
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ;
                      std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr<mocker::nasm::Register,void>
                                ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)
                                 &pReg,p_Var13);
                      anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()
                                (&store,(shared_ptr<mocker::nasm::Register> *)&dest,
                                 (shared_ptr<mocker::nasm::Addr> *)&pReg);
                      goto LAB_00126104;
                    }
                    std::__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<mocker::nasm::UnaryInst,void>
                              (local_160,
                               (__shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2> *)
                               &operand);
                    nasm::Section::appendInst
                              (&local_298,(shared_ptr<mocker::nasm::Inst> *)local_160);
                    p_Var16 = &local_158;
                  }
                }
                else {
                  std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<mocker::nasm::Register,void>
                            ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                             (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                             (CONCAT44(operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._4_4_,
                                       operand.
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_4_) + 0x10));
                  anon_unknown_1::dycVReg(&dest);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&pReg.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  if (dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      != (element_type *)0x0) {
                    std::make_shared<mocker::nasm::Register,char_const(&)[5]>((char (*) [5])&pReg);
                    vReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._0_4_ = *(undefined4 *)
                                    (CONCAT44(operand.
                                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr._4_4_,
                                              operand.
                                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr._0_4_) + 8);
                    nasm::Section::
                    emplaceInst<mocker::nasm::Set,mocker::nasm::Set::OpType,std::shared_ptr<mocker::nasm::Register>&>
                              (&local_298,(OpType *)&vReg,&pReg);
                    p_Var13 = &nasm::r10()->
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<mocker::nasm::Register,void>
                              ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&vReg,
                               p_Var13);
                    anon_unknown_1::storeVReg
                              ((shared_ptr<mocker::nasm::Register> *)&dest,
                               (shared_ptr<mocker::nasm::Addr> *)&vReg,
                               (RegMap<std::size_t> *)&offsets._M_h,&local_298);
                    goto LAB_001260fa;
                  }
                  std::__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<mocker::nasm::Set,void>
                            (local_150,
                             (__shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2> *)&operand
                            );
                  nasm::Section::appendInst(&local_298,(shared_ptr<mocker::nasm::Inst> *)local_150);
                  p_Var16 = &local_148;
                }
              }
              else {
                std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::nasm::Register,void>
                          ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                           (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                           (CONCAT44(operand.
                                     super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     operand.
                                     super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_4_) + 8));
                anon_unknown_1::dycVReg(&dest);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&pReg.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    == (element_type *)0x0) {
                  __assert_fail("reg",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                ,0xb2,
                                "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                               );
                }
                psVar12 = nasm::r10();
                nasm::Section::
                emplaceInst<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Register>const&>
                          (&local_298,psVar12);
                p_Var13 = &nasm::r10()->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::nasm::Register,void>
                          ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                           p_Var13);
                anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()
                          (&store,(shared_ptr<mocker::nasm::Register> *)&dest,
                           (shared_ptr<mocker::nasm::Addr> *)&pReg);
LAB_00126104:
                p_Var16 = &pReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var16);
            }
            else {
              std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<mocker::nasm::Register,void>
                        ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&pReg,
                         (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                         (CONCAT44(operand.
                                   super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr._4_4_,
                                   operand.
                                   super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr._0_4_) + 8));
              anon_unknown_1::dycVReg(&dest);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&pReg.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                __assert_fail("reg",
                              "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                              ,0xab,
                              "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                             );
              }
              psVar12 = nasm::r10();
              anon_unknown_1::allocate::anon_class_16_2_521579e4::operator()
                        (&load,psVar12,(shared_ptr<mocker::nasm::Register> *)&dest);
              psVar12 = nasm::r10();
              nasm::Section::
              emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>const&>
                        (&local_298,psVar12);
            }
LAB_001261c4:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            p_Var16 = &operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
          }
          else {
            std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>,
                       &((p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->operand).
                        super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
            std::dynamic_pointer_cast<mocker::nasm::NumericConstant,mocker::nasm::Addr>(&dest);
            if (dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              anon_unknown_1::dycPReg((shared_ptr<mocker::nasm::Addr> *)&pReg);
              if (CONCAT44(pReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._4_4_,
                           pReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._0_4_) == 0) {
                anon_unknown_1::dycVReg((shared_ptr<mocker::nasm::Addr> *)&vReg);
                if (CONCAT44(vReg.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._4_4_,
                             vReg.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._0_4_) == 0) {
                  std::dynamic_pointer_cast<mocker::nasm::LabelAddr,mocker::nasm::Addr>
                            ((shared_ptr<mocker::nasm::Addr> *)&labelAddr);
                  if (labelAddr.
                      super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    std::dynamic_pointer_cast<mocker::nasm::MemoryAddr,mocker::nasm::Addr>
                              ((shared_ptr<mocker::nasm::Addr> *)&memAddr);
                    lVar17 = CONCAT44(memAddr.
                                      super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._4_4_,
                                      memAddr.
                                      super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._0_4_);
                    if (lVar17 == 0) {
                      pcVar8 = "false";
                      __line = 99;
                      goto LAB_00126bb8;
                    }
                    if (*(long *)(lVar17 + 0x18) != 0) {
                      pcVar8 = "!memAddr->getReg2()";
                      __line = 0x5a;
                      goto LAB_00126bb8;
                    }
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&reg1.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 ,(__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   *)(lVar17 + 8));
                    std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<mocker::nasm::Register,void>
                              ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)
                               local_1f0,
                               &reg1.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              );
                    anon_unknown_1::dycVReg(&local_210);
                    peVar4 = local_210.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&local_210.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8);
                    if (peVar4 != (element_type *)0x0) {
                      psVar12 = nasm::r11();
                      anon_unknown_1::loadVReg
                                (psVar12,&reg1,(RegMap<std::size_t> *)&offsets._M_h,&local_298);
                      p_Var13 = &nasm::r11()->
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ;
                      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                      operator=(&reg1.
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ,p_Var13);
                    }
                    psVar12 = nasm::r10();
                    local_1f0[0] = *(undefined4 *)
                                    (CONCAT44(memAddr.
                                              super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr._4_4_,
                                              memAddr.
                                              super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr._0_4_) + 0x30);
                    std::
                    make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>&,int>
                              ((shared_ptr<mocker::nasm::Register> *)&local_210,(int *)&reg1);
                    nasm::Section::
                    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::MemoryAddr>>
                              (&local_298,psVar12,(shared_ptr<mocker::nasm::MemoryAddr> *)&local_210
                              );
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&local_210.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&reg1.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&memAddr.
                                super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                  else {
                    psVar12 = nasm::r10();
                    nasm::Section::
                    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::LabelAddr>&>
                              (&local_298,psVar12,&labelAddr);
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&labelAddr.
                              super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
                else {
                  psVar12 = nasm::r10();
                  anon_unknown_1::loadVReg
                            (psVar12,&vReg,(RegMap<std::size_t> *)&offsets._M_h,&local_298);
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&vReg.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              else {
                psVar12 = nasm::r10();
                nasm::Section::
                emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
                          (&local_298,psVar12,&pReg);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&pReg.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              psVar12 = nasm::r10();
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>&>
                        (&local_298,psVar12,(shared_ptr<mocker::nasm::NumericConstant> *)&dest);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>,
                       &((p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->dest).super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                      );
            anon_unknown_1::dycPReg((shared_ptr<mocker::nasm::Addr> *)&pReg);
            if (CONCAT44(pReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         pReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_) == 0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&pReg.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              anon_unknown_1::dycVReg((shared_ptr<mocker::nasm::Addr> *)&pReg);
              if (CONCAT44(pReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._4_4_,
                           pReg.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._0_4_) == 0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&pReg.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::LabelAddr,mocker::nasm::Addr>
                          ((shared_ptr<mocker::nasm::Addr> *)&pReg);
                if (CONCAT44(pReg.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._4_4_,
                             pReg.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._0_4_) != 0) {
                  psVar12 = nasm::r10();
                  nasm::Section::
                  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::LabelAddr>&,std::shared_ptr<mocker::nasm::Register>const&>
                            (&local_298,(shared_ptr<mocker::nasm::LabelAddr> *)&pReg,psVar12);
                  goto LAB_001265aa;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&pReg.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::MemoryAddr,mocker::nasm::Addr>
                          ((shared_ptr<mocker::nasm::Addr> *)&pReg);
                lVar17 = CONCAT44(pReg.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._4_4_,
                                  pReg.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._0_4_);
                if (lVar17 == 0) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&pReg.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                ,0x81,
                                "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                               );
                }
                if (*(long *)(lVar17 + 0x18) != 0) {
                  pcVar8 = "!memAddr->getReg2()";
                  __line = 0x75;
LAB_00126bb8:
                  __assert_fail(pcVar8,
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                ,__line,
                                "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                               );
                }
                std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&vReg.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>,
                           (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                           (lVar17 + 8));
                std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::nasm::Register,void>
                          ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&memAddr,
                           &vReg.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>);
                anon_unknown_1::dycVReg((shared_ptr<mocker::nasm::Addr> *)&labelAddr);
                peVar3 = labelAddr.
                         super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&labelAddr.
                            super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&memAddr.
                            super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                if (peVar3 != (element_type *)0x0) {
                  psVar12 = nasm::r11();
                  anon_unknown_1::loadVReg
                            (psVar12,&vReg,(RegMap<std::size_t> *)&offsets._M_h,&local_298);
                  p_Var13 = &nasm::r11()->
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&vReg.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                             ,p_Var13);
                }
                psVar12 = nasm::r11();
                memAddr.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._0_4_ = *(undefined4 *)
                                (CONCAT44(pReg.
                                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._4_4_,
                                          pReg.
                                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._0_4_) + 0x30);
                std::
                make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>const&,int>
                          ((shared_ptr<mocker::nasm::Register> *)&labelAddr,(int *)psVar12);
                psVar12 = nasm::r10();
                nasm::Section::
                emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&>
                          (&local_298,(shared_ptr<mocker::nasm::MemoryAddr> *)&labelAddr,psVar12);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&labelAddr.
                            super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              else {
                p_Var13 = &nasm::r10()->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::nasm::Register,void>
                          ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&vReg,
                           p_Var13);
                anon_unknown_1::storeVReg
                          (&pReg,(shared_ptr<mocker::nasm::Addr> *)&vReg,
                           (RegMap<std::size_t> *)&offsets._M_h,&local_298);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&vReg.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              psVar12 = nasm::r10();
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                        (&local_298,&pReg,psVar12);
            }
LAB_001265aa:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&pReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&dest.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&operand.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            p_Var16 = &p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var16);
      }
    }
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&offsets._M_h);
  } while( true );
}

Assistant:

nasm::Module allocateRegistersNaively(const nasm::Module &module) {
  nasm::Module res(module);
  res.getSection(".text") = allocate(res.getSection(".text"));
  return res;
}